

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MemPass::RemovePhiOperands
          (MemPass *this,Instruction *phi,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *reachable_blocks)

{
  uint uVar1;
  uint32_t uVar2;
  Operand *pOVar3;
  CFG *this_00;
  const_iterator cVar4;
  DefUseManager *this_01;
  Instruction *instr;
  uint index;
  initializer_list<unsigned_int> init_list;
  uint32_t local_cc;
  uint32_t local_c4;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_c0;
  BasicBlock *def_block;
  BasicBlock *in_block;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> keep_operands;
  SmallVector<unsigned_int,_2UL> local_88;
  Operand local_60;
  
  keep_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keep_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keep_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  index = 0;
  local_cc = 0;
  local_c0 = &reachable_blocks->_M_h;
  do {
    while( true ) {
      uVar1 = (uint)(((long)(phi->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(phi->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x30);
      if (uVar1 <= index) {
        IRContext::ForgetUses((this->super_Pass).context_,phi);
        Instruction::ReplaceOperands(phi,&keep_operands);
        IRContext::AnalyzeUses((this->super_Pass).context_,phi);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&keep_operands);
        return;
      }
      if (1 < index) break;
      pOVar3 = Instruction::GetOperand(phi,index);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                (&keep_operands,pOVar3);
      index = index + 1;
    }
    if (((index & 1) != 0) || (uVar1 - 1 <= index)) {
      __assert_fail("i % 2 == 0 && i < phi->NumOperands() - 1 && \"malformed Phi arguments\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp"
                    ,0x163,
                    "void spvtools::opt::MemPass::RemovePhiOperands(Instruction *, const std::unordered_set<BasicBlock *> &)"
                   );
    }
    this_00 = Pass::cfg(&this->super_Pass);
    uVar2 = Instruction::GetSingleWordOperand(phi,index + 1);
    in_block = CFG::block(this_00,uVar2);
    cVar4 = std::
            _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(local_c0,&in_block);
    if (cVar4.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur !=
        (__node_type *)0x0) {
      uVar2 = Instruction::GetSingleWordOperand(phi,index);
      this_01 = Pass::get_def_use_mgr(&this->super_Pass);
      instr = analysis::DefUseManager::GetDef(this_01,uVar2);
      def_block = IRContext::get_instr_block((this->super_Pass).context_,instr);
      if (def_block == (BasicBlock *)0x0) {
LAB_0021eba9:
        pOVar3 = Instruction::GetOperand(phi,index);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  (&keep_operands,pOVar3);
      }
      else {
        cVar4 = std::
                _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(local_c0,&def_block);
        if (cVar4.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur !=
            (__node_type *)0x0) goto LAB_0021eba9;
        if (local_cc == 0) {
          uVar2 = Instruction::type_id(instr);
          local_cc = Type2Undef(this,uVar2);
        }
        init_list._M_len = 1;
        init_list._M_array = &local_c4;
        local_c4 = local_cc;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,init_list);
        local_60.type = SPV_OPERAND_TYPE_ID;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_60.words,&local_88);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&keep_operands,&local_60);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_60.words);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88);
      }
      pOVar3 = Instruction::GetOperand(phi,index + 1);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                (&keep_operands,pOVar3);
    }
    index = index + 2;
  } while( true );
}

Assistant:

void MemPass::RemovePhiOperands(
    Instruction* phi, const std::unordered_set<BasicBlock*>& reachable_blocks) {
  std::vector<Operand> keep_operands;
  uint32_t type_id = 0;
  // The id of an undefined value we've generated.
  uint32_t undef_id = 0;

  // Traverse all the operands in |phi|. Build the new operand vector by adding
  // all the original operands from |phi| except the unwanted ones.
  for (uint32_t i = 0; i < phi->NumOperands();) {
    if (i < 2) {
      // The first two arguments are always preserved.
      keep_operands.push_back(phi->GetOperand(i));
      ++i;
      continue;
    }

    // The remaining Phi arguments come in pairs. Index 'i' contains the
    // variable id, index 'i + 1' is the originating block id.
    assert(i % 2 == 0 && i < phi->NumOperands() - 1 &&
           "malformed Phi arguments");

    BasicBlock* in_block = cfg()->block(phi->GetSingleWordOperand(i + 1));
    if (reachable_blocks.find(in_block) == reachable_blocks.end()) {
      // If the incoming block is unreachable, remove both operands as this
      // means that the |phi| has lost an incoming edge.
      i += 2;
      continue;
    }

    // In all other cases, the operand must be kept but may need to be changed.
    uint32_t arg_id = phi->GetSingleWordOperand(i);
    Instruction* arg_def_instr = get_def_use_mgr()->GetDef(arg_id);
    BasicBlock* def_block = context()->get_instr_block(arg_def_instr);
    if (def_block &&
        reachable_blocks.find(def_block) == reachable_blocks.end()) {
      // If the current |phi| argument was defined in an unreachable block, it
      // means that this |phi| argument is no longer defined. Replace it with
      // |undef_id|.
      if (!undef_id) {
        type_id = arg_def_instr->type_id();
        undef_id = Type2Undef(type_id);
      }
      keep_operands.push_back(
          Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {undef_id}));
    } else {
      // Otherwise, the argument comes from a reachable block or from no block
      // at all (meaning that it was defined in the global section of the
      // program).  In both cases, keep the argument intact.
      keep_operands.push_back(phi->GetOperand(i));
    }

    keep_operands.push_back(phi->GetOperand(i + 1));

    i += 2;
  }

  context()->ForgetUses(phi);
  phi->ReplaceOperands(keep_operands);
  context()->AnalyzeUses(phi);
}